

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O1

void __thiscall EDColor::extractNewSegments(EDColor *this)

{
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *this_00;
  long lVar1;
  pointer pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> subVec;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  validSegments;
  int local_80;
  allocator_type local_79;
  void *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_58;
  ulong local_38;
  
  local_58.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->segments;
  if ((this->segments).
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->segments).
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_80 = 0;
  }
  else {
    uVar8 = 0;
    local_80 = 0;
    do {
      pvVar2 = (this_00->
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = *(long *)&pvVar2[uVar8].
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data;
      lVar6 = (long)*(pointer *)
                     ((long)&pvVar2[uVar8].
                             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                             _M_impl.super__Vector_impl_data + 8) - lVar5;
      local_38 = uVar8;
      if (lVar6 != 0) {
        uVar7 = lVar6 >> 3;
        iVar10 = 0;
        do {
          uVar9 = (ulong)iVar10;
          uVar12 = uVar9;
          if (uVar9 < uVar7) {
            uVar12 = uVar7;
          }
          iVar11 = (int)uVar12;
          iVar10 = iVar10 + -1;
          do {
            if (uVar7 <= uVar9) goto LAB_00115b0d;
            lVar1 = uVar9 * 8;
            lVar6 = uVar9 * 8;
            uVar9 = uVar9 + 1;
            iVar10 = iVar10 + 1;
          } while (this->edgeImg
                   [(long)*(int *)(lVar5 + lVar6) +
                    (long)*(int *)(lVar5 + 4 + lVar1) * (long)this->width] == '\0');
          iVar11 = iVar10 + (uint)(this->edgeImg
                                   [(long)*(int *)(lVar5 + lVar6) +
                                    (long)*(int *)(lVar5 + 4 + lVar1) * (long)this->width] == '\0');
LAB_00115b0d:
          uVar9 = (ulong)(iVar11 + 1);
          uVar12 = uVar9;
          if (uVar9 < uVar7) {
            uVar12 = uVar7;
          }
          iVar10 = (int)uVar12;
          iVar4 = iVar11;
          do {
            iVar3 = iVar4;
            if (uVar7 <= uVar9) goto LAB_00115b5f;
            lVar1 = uVar9 * 8;
            lVar6 = uVar9 * 8;
            uVar9 = uVar9 + 1;
            iVar4 = iVar3 + 1;
          } while (this->edgeImg
                   [(long)*(int *)(lVar5 + lVar6) +
                    (long)*(int *)(lVar5 + 4 + lVar1) * (long)this->width] != '\0');
          iVar10 = iVar3 + 1;
LAB_00115b5f:
          if (9 < iVar10 - iVar11) {
            local_78 = (void *)0x0;
            uStack_70 = 0;
            local_68 = 0;
            std::
            vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
            ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                      ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                        *)&local_58,
                       (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_78);
            if (local_78 != (void *)0x0) {
              operator_delete(local_78);
            }
            lVar5 = *(long *)&(this_00->
                              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar8].
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data;
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            vector<cv::Point_<int>*,void>
                      ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_78,
                       (Point_<int> *)(lVar5 + (long)iVar11 * 8),
                       (Point_<int> *)(lVar5 + -8 + (long)iVar10 * 8),&local_79);
            std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=
                      (local_58.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_80,
                       (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_78);
            if (local_78 != (void *)0x0) {
              operator_delete(local_78);
            }
            local_80 = local_80 + 1;
          }
          iVar10 = iVar10 + 1;
          pvVar2 = (this_00->
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar5 = *(long *)&pvVar2[uVar8].
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data;
          uVar7 = (long)*(pointer *)
                         ((long)&pvVar2[uVar8].
                                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                 ._M_impl.super__Vector_impl_data + 8) - lVar5 >> 3;
        } while ((ulong)(long)iVar10 < uVar7);
      }
      uVar8 = local_38 + 1;
      uVar7 = ((long)(this->segments).
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->segments).
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::operator=(this_00,&local_58);
  this->segmentNo = local_80;
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void EDColor::extractNewSegments()
{
	vector< vector<Point> > validSegments;
	int noSegments = 0;

	for (int i = 0; i < segments.size(); i++) {
		int start = 0;
		while (start < segments[i].size()) {

			while (start < segments[i].size()) {
				int r = segments[i][start].y;
				int c = segments[i][start].x;

				if (edgeImg[r*width + c]) break;
				start++;
			} //end-while

			int end = start + 1;
			while (end < segments[i].size()) {
				int r = segments[i][end].y;
				int c = segments[i][end].x;

				if (edgeImg[r*width + c] == 0) break;
				end++;
			} //end-while

			int len = end - start;
			if (len >= 10) {
				// A new segment. Accepted only only long enough (whatever that means)
				//segments[noSegments].pixels = &map->segments[i].pixels[start];
				//segments[noSegments].noPixels = len;
				validSegments.push_back(vector<Point>());
				vector<Point> subVec(&segments[i][start], &segments[i][end - 1]);
				validSegments[noSegments] = subVec;
				noSegments++;
			} //end-else

			start = end + 1;
		} //end-while
	} //end-for

	// Update
	segments = validSegments;
	segmentNo = noSegments; // = validSegments.size()

}